

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O2

void __thiscall TArray<FName,_FName>::DoCopy(TArray<FName,_FName> *this,TArray<FName,_FName> *other)

{
  uint uVar1;
  FName *pFVar2;
  FName *pFVar3;
  ulong uVar4;
  
  uVar1 = other->Count;
  this->Count = uVar1;
  this->Most = uVar1;
  if ((ulong)uVar1 == 0) {
    this->Array = (FName *)0x0;
  }
  else {
    pFVar3 = (FName *)M_Malloc_Dbg((ulong)uVar1 << 2,
                                   "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/tarray.h"
                                   ,0x19e);
    this->Array = pFVar3;
    uVar1 = this->Count;
    pFVar2 = other->Array;
    for (uVar4 = 0; uVar1 != uVar4; uVar4 = uVar4 + 1) {
      pFVar3[uVar4].Index = pFVar2[uVar4].Index;
    }
  }
  return;
}

Assistant:

void DoCopy (const TArray<T> &other)
	{
		Most = Count = other.Count;
		if (Count != 0)
		{
			Array = (T *)M_Malloc (sizeof(T)*Most);
			for (unsigned int i = 0; i < Count; ++i)
			{
				::new(&Array[i]) T(other.Array[i]);
			}
		}
		else
		{
			Array = NULL;
		}
	}